

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::OptMatchCharInst::Print
          (OptMatchCharInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  OptMatchCharInst *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",3);
  }
  DebugWriter::Print(w,L"OptMatchChar");
  DebugWriter::Print(w,L"(");
  CharMixin::Print(&this->super_CharMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::CharMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_CharMixin,L"CharMixin");
    DebugWriter::Unindent(w);
  }
  return 3;
}

Assistant:

int OptMatchCharInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("OptMatchChar");
        PRINT_MIXIN(CharMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(CharMixin);
        PRINT_RE_BYTECODE_END();
    }